

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles3::Stress::(anonymous_namespace)::TextureSamplerCase::genFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  ulong uVar1;
  char *pcVar2;
  bool bVar3;
  ostringstream buf;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  if (*(int *)((long)this + 0x84) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,
               "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_out;\nvoid main ()\n{\n\tfragColor = v_out;\n}\n"
               ,"");
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;\n",0x41);
    bVar3 = *(int *)((long)this + 0x88) == 3;
    pcVar2 = "uniform highp sampler2D u_sampler;\n";
    if (bVar3) {
      pcVar2 = "uniform highp samplerCube u_sampler;\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,pcVar2,(ulong)bVar3 * 2 + 0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"in highp vec4 v_attr;\nvoid main ()\n{\n",0x25);
    uVar1 = (ulong)*(uint *)((long)this + 0x88);
    if (uVar1 < 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,&DAT_00b64678 + *(int *)(&DAT_00b64678 + uVar1 * 4),
                 *(long *)(&DAT_00b66790 + uVar1 * 8));
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
    std::ios_base::~ios_base(local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TextureSamplerCase::genFragmentSource (void) const
{
	// fragment shader is passthrough
	if (m_type == TYPE_VERTEX)
		return s_colorPassthroughFragmentShaderSource;

	// fragment shader does the calculations
	std::ostringstream buf;
	buf <<	"#version 300 es\n"
			"layout(location = 0) out mediump vec4 fragColor;\n";

	if (m_testType != TEST_TEX_COORD_CUBE)
		buf <<	"uniform highp sampler2D u_sampler;\n";
	else
		buf <<	"uniform highp samplerCube u_sampler;\n";

	buf <<	"in highp vec4 v_attr;\n"
			"void main ()\n"
			"{\n";

	if (m_testType == TEST_TEX_COORD)
		buf << "	fragColor = texture(u_sampler, v_attr.xy);\n";
	else if (m_testType == TEST_LOD)
		buf << "	fragColor = texture(u_sampler, v_attr.xy, v_attr.x);\n";
	else if (m_testType == TEST_GRAD)
		buf <<	"	fragColor = textureGrad(u_sampler, v_attr.xy, v_attr.xy, v_attr.yx);\n";
	else if (m_testType == TEST_TEX_COORD_CUBE)
		buf <<	"	fragColor = texture(u_sampler, vec3(v_attr.xy,v_attr.x + v_attr.y));\n";
	else
		DE_ASSERT(DE_FALSE);

	buf <<	"}\n";

	return buf.str();
}